

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_bitmap_remove_checked(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode;
  container_t *c;
  uint i;
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  container_t *c_00;
  uint8_t typecode_00;
  _Bool _Var3;
  uint8_t newtypecode;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  i = ra_get_index(&r->high_low_container,(uint16_t)(val >> 0x10));
  if ((int)i < 0) {
    _Var3 = false;
  }
  else {
    ra_unshare_container_at_index(&r->high_low_container,(uint16_t)i);
    typecode = (r->high_low_container).typecodes[i & 0xffff];
    c = (r->high_low_container).containers[i & 0xffff];
    iVar1 = container_get_cardinality(c,typecode);
    uStack_38._7_1_ = typecode;
    c_00 = container_remove(c,(uint16_t)val,typecode,(uint8_t *)((long)&uStack_38 + 7));
    typecode_00 = uStack_38._7_1_;
    if (c_00 != c) {
      container_free(c,typecode);
      typecode_00 = uStack_38._7_1_;
      ra_set_container_at_index(&r->high_low_container,i,c_00,uStack_38._7_1_);
    }
    iVar2 = container_get_cardinality(c_00,typecode_00);
    if (iVar2 == 0) {
      ra_remove_at_index_and_free(&r->high_low_container,i);
    }
    else {
      ra_set_container_at_index(&r->high_low_container,i,c_00,typecode_00);
    }
    _Var3 = iVar1 != iVar2;
  }
  return _Var3;
}

Assistant:

bool roaring_bitmap_remove_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, i);
        container_t *container =
            ra_get_container_at_index(&r->high_low_container, i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }

        const int newCardinality =
            container_get_cardinality(container2, newtypecode);

        if (newCardinality != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }

        result = oldCardinality != newCardinality;
    }
    return result;
}